

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtConvexHullComputer.cpp
# Opt level: O1

void __thiscall
cbtConvexHullInternal::Pool<cbtConvexHullInternal::Face>::~Pool
          (Pool<cbtConvexHullInternal::Face> *this)

{
  PoolArray<cbtConvexHullInternal::Face> *ptr;
  
  while (ptr = this->arrays, ptr != (PoolArray<cbtConvexHullInternal::Face> *)0x0) {
    this->arrays = ptr->next;
    cbtAlignedFreeInternal(ptr->array);
    cbtAlignedFreeInternal(ptr);
  }
  return;
}

Assistant:

~Pool()
		{
			while (arrays)
			{
				PoolArray<T>* p = arrays;
				arrays = p->next;
				p->~PoolArray<T>();
				cbtAlignedFree(p);
			}
		}